

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase196::run(TestCase196 *this)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t amount;
  ArrayPtr<unsigned_char> scratch;
  Arena arena;
  anon_union_64_2_42f82436 anon_var_0;
  uchar *local_90;
  uchar *local_88;
  Arena local_80;
  uchar local_60 [64];
  
  scratch.size_ = 0x40;
  scratch.ptr = local_60;
  Arena::Arena(&local_80,scratch);
  puVar1 = (uchar *)Arena::allocateBytes(&local_80,8,8,false);
  if ((puVar1 < local_60) && (_::Debug::minSeverity < 3)) {
    local_90 = puVar1;
    _::Debug::log<char_const(&)[60],unsigned_char*,unsigned_char(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xcd,ERROR,
               "\"failed: expected \" \"(reinterpret_cast<byte*>(&i)) >= (scratch)\", reinterpret_cast<byte*>(&i), scratch"
               ,(char (*) [60])"failed: expected (reinterpret_cast<byte*>(&i)) >= (scratch)",
               &local_90,&local_60);
  }
  if ((&stack0xffffffffffffffe0 <= puVar1) && (_::Debug::minSeverity < 3)) {
    local_90 = puVar1;
    local_88 = &stack0xffffffffffffffe0;
    _::Debug::log<char_const(&)[77],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"(reinterpret_cast<byte*>(&i)) < (scratch + sizeof(scratch))\", reinterpret_cast<byte*>(&i), scratch + sizeof(scratch)"
               ,(char (*) [77])
                "failed: expected (reinterpret_cast<byte*>(&i)) < (scratch + sizeof(scratch))",
               &local_90,&local_88);
  }
  puVar2 = (uchar *)Arena::allocateBytes(&local_80,8,8,false);
  if ((puVar1 + 8 != puVar2) && (_::Debug::minSeverity < 3)) {
    local_90 = puVar1 + 8;
    local_88 = puVar2;
    _::Debug::log<char_const(&)[35],unsigned_long*,unsigned_long*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xd2,ERROR,"\"failed: expected \" \"(&i + 1) == (&i2)\", &i + 1, &i2",
               (char (*) [35])"failed: expected (&i + 1) == (&i2)",(unsigned_long **)&local_90,
               (unsigned_long **)&local_88);
  }
  puVar2 = puVar2 + 8;
  amount = (long)&stack0xffffffffffffffe0 - (long)puVar2;
  puVar1 = (uchar *)Arena::allocateBytes(&local_80,amount,1,false);
  if ((puVar2 != puVar1) && (_::Debug::minSeverity < 3)) {
    local_90 = puVar2;
    local_88 = puVar1;
    _::Debug::log<char_const(&)[75],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xd7,ERROR,
               "\"failed: expected \" \"(reinterpret_cast<byte*>(&i2 + 1)) == (remaining.begin())\", reinterpret_cast<byte*>(&i2 + 1), remaining.begin()"
               ,(char (*) [75])
                "failed: expected (reinterpret_cast<byte*>(&i2 + 1)) == (remaining.begin())",
               &local_90,&local_88);
  }
  puVar2 = (uchar *)Arena::allocateBytes(&local_80,8,8,false);
  if ((puVar1 + amount == puVar2) && (_::Debug::minSeverity < 3)) {
    local_90 = puVar1 + amount;
    local_88 = puVar2;
    _::Debug::log<char_const(&)[69],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"(remaining.end()) != (reinterpret_cast<byte*>(&i3))\", remaining.end(), reinterpret_cast<byte*>(&i3)"
               ,(char (*) [69])
                "failed: expected (remaining.end()) != (reinterpret_cast<byte*>(&i3))",&local_90,
               &local_88);
  }
  Arena::~Arena(&local_80);
  return;
}

Assistant:

TEST(Arena, EndOfChunk) {
  union {
    byte scratch[64];
    uint64_t align;
  };
  Arena arena(arrayPtr(scratch, sizeof(scratch)));

  // First allocation will come from somewhere in the scratch space (after the chunk header).
  uint64_t& i = arena.allocate<uint64_t>();
  EXPECT_GE(reinterpret_cast<byte*>(&i), scratch);
  EXPECT_LT(reinterpret_cast<byte*>(&i), scratch + sizeof(scratch));

  // Next allocation will come at the next position.
  uint64_t& i2 = arena.allocate<uint64_t>();
  EXPECT_EQ(&i + 1, &i2);

  // Allocate the rest of the scratch space.
  size_t spaceLeft = scratch + sizeof(scratch) - reinterpret_cast<byte*>(&i2 + 1);
  ArrayPtr<byte> remaining = arena.allocateArray<byte>(spaceLeft);
  EXPECT_EQ(reinterpret_cast<byte*>(&i2 + 1), remaining.begin());

  // Next allocation comes from somewhere new.
  uint64_t& i3 = arena.allocate<uint64_t>();
  EXPECT_NE(remaining.end(), reinterpret_cast<byte*>(&i3));
}